

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void Js::ScriptContext::RecyclerEnumClassEnumeratorCallback(void *address,size_t size)

{
  long *plVar1;
  code *pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  JavascriptMethod p_Var8;
  FunctionProxy *this;
  JavascriptMethod p_Var9;
  ScriptFunction *this_00;
  ProxyEntryPointInfo *entryPointInfo;
  
  plVar1 = *(long **)(*(long *)(*(long *)((long)address + 8) + 8) + 0x490);
  if ((((plVar1 != (long *)0x0) && (cVar3 = (**(code **)(*plVar1 + 0x120))(plVar1), cVar3 == '\0'))
      && (*(char *)((long)plVar1 + 0x3b2) == '\x01')) &&
     ((iVar5 = (**(code **)(*address + 0x370))(address), iVar5 == 0 &&
      (iVar5 = (**(code **)(*address + 0x378))(address), iVar5 == 0)))) {
    if ((*(char *)((long)plVar1 + 0x3b3) == '\x01') &&
       (BVar6 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)address), BVar6 != 0)) {
      return;
    }
    if (*(undefined1 **)((long)address + 0x28) ==
        JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x107d,
                                  "(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk)"
                                  ,
                                  "pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk"
                                 );
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)address);
    this = JavascriptFunction::GetFunctionProxy((JavascriptFunction *)address);
    if (this == (FunctionProxy *)0x0) {
      SetEntryPointToProfileThunk((JavascriptFunction *)address);
      return;
    }
    BVar6 = IsIntermediateCodeGenThunk(p_Var8);
    if ((p_Var8 != DynamicProfileInfo::EnsureDynamicProfileInfoThunk) && (BVar6 == 0)) {
      p_Var9 = GetProfileModeThunk(p_Var8);
      Output::Trace(ScriptProfilerPhase,L"\t\tJs::ScriptContext::GetProfileModeThunk : 0x%08X\n",
                    p_Var9);
      this_00 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>((JavascriptFunction *)address);
      entryPointInfo = FunctionProxy::GetDefaultEntryPointInfo(this);
      p_Var8 = GetProfileModeThunk(p_Var8);
      ScriptFunction::ChangeEntryPoint(this_00,entryPointInfo,p_Var8);
      return;
    }
  }
  return;
}

Assistant:

void ScriptContext::RecyclerEnumClassEnumeratorCallback(void *address, size_t size)
    {
        // TODO: we are assuming its function because for now we are enumerating only on functions
        // In future if the RecyclerNewEnumClass is used of Recyclable objects or Dynamic object, we would need a check if it is function
        JavascriptFunction *pFunction = (JavascriptFunction *)address;

        ScriptContext* scriptContext = pFunction->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            // Can't enumerate from closed scriptcontext
            return;
        }

        if (!scriptContext->IsEnumeratingRecyclerObjects())
        {
            return; // function not from enumerating script context
        }

        if (!scriptContext->IsTraceDomCall() && (pFunction->IsExternalFunction() || pFunction->IsWinRTFunction()))
        {
            return;
        }

        if (scriptContext->IsEnumerateNonUserFunctionsOnly() && pFunction->IsScriptFunction())
        {
            return;
        }

        // Wrapped function are not allocated with the EnumClass bit
        Assert(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk);

        JavascriptMethod entryPoint = pFunction->GetEntryPoint();
        FunctionProxy *proxy = pFunction->GetFunctionProxy();

        if (proxy != NULL)
        {
#if defined(ENABLE_SCRIPT_PROFILING)
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("ScriptContext::RecyclerEnumClassEnumeratorCallback\n"));
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\tFunctionProxy : 0x%08X, FunctionNumber : %s, DeferredParseAttributes : %d, EntryPoint : 0x%08X"),
                (DWORD_PTR)proxy, proxy->GetDebugNumberSet(debugStringBuffer), proxy->GetAttributes(), (DWORD_PTR)entryPoint);
#if ENABLE_NATIVE_CODEGEN
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u(" (IsIntermediateCodeGenThunk : %s, isNative : %s)\n"),
                IsTrueOrFalse(IsIntermediateCodeGenThunk(entryPoint)), IsTrueOrFalse(scriptContext->IsNativeAddress(entryPoint)));
#endif
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\n"));
#endif

#if ENABLE_NATIVE_CODEGEN
            if (!IsIntermediateCodeGenThunk(entryPoint) && entryPoint != DynamicProfileInfo::EnsureDynamicProfileInfoThunk)
#endif
            {
                OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\t\tJs::ScriptContext::GetProfileModeThunk : 0x%08X\n"), (DWORD_PTR)Js::ScriptContext::GetProfileModeThunk(entryPoint));

                ScriptFunction * scriptFunction = VarTo<ScriptFunction>(pFunction);
                scriptFunction->ChangeEntryPoint(proxy->GetDefaultEntryPointInfo(), Js::ScriptContext::GetProfileModeThunk(entryPoint));

#if ENABLE_NATIVE_CODEGEN && defined(ENABLE_SCRIPT_PROFILING)
                OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\tUpdated entrypoint : 0x%08X (isNative : %s)\n"), (DWORD_PTR)pFunction->GetEntryPoint(), IsTrueOrFalse(scriptContext->IsNativeAddress(entryPoint)));
#endif
            }
        }
        else
        {
            ScriptContext::SetEntryPointToProfileThunk(pFunction);
        }
    }